

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

void anon_unknown.dwarf_ac3::ndiPHINFHelper(ndicapi *pol,char *cp,char *crp)

{
  bool bVar1;
  int local_38;
  int local_34;
  int unoccupied;
  int j;
  char *dp;
  unsigned_long mode;
  char *crp_local;
  char *cp_local;
  ndicapi *pol_local;
  
  dp = (char *)0x1;
  local_38 = 0;
  if (((cp[5] == ':') && (cp[10] != '\r')) || ((cp[5] == ' ' && (cp[6] != '\r')))) {
    dp = (char *)ndiHexToUnsignedLong(cp + 8,4);
  }
  if (*crp == 'U') {
    local_38 = 3;
  }
  pol->PhinfUnoccupied = local_38;
  mode = (unsigned_long)crp;
  if (((ulong)dp & 1) != 0) {
    _unoccupied = pol->PhinfBasic;
    if (local_38 == 0) {
      local_34 = 0;
      mode = (unsigned_long)crp;
      while( true ) {
        bVar1 = false;
        if (local_34 < 0x21) {
          bVar1 = '\x1f' < *(char *)mode;
        }
        if (!bVar1) break;
        *_unoccupied = *(char *)mode;
        local_34 = local_34 + 1;
        _unoccupied = _unoccupied + 1;
        mode = mode + 1;
      }
    }
    else {
      for (local_34 = 0; local_34 < 8; local_34 = local_34 + 1) {
        *_unoccupied = '0';
        _unoccupied = _unoccupied + 1;
      }
      for (local_34 = 0; local_34 < 0xc; local_34 = local_34 + 1) {
        *_unoccupied = ' ';
        _unoccupied = _unoccupied + 1;
      }
      for (local_34 = 0; local_34 < 0xd; local_34 = local_34 + 1) {
        *_unoccupied = '0';
        _unoccupied = _unoccupied + 1;
      }
    }
  }
  if (((ulong)dp & 2) != 0) {
    _unoccupied = pol->PhinfTesting;
    if (local_38 == 0) {
      local_34 = 0;
      while( true ) {
        bVar1 = false;
        if (local_34 < 8) {
          bVar1 = '\x1f' < *(char *)mode;
        }
        if (!bVar1) break;
        *_unoccupied = *(char *)mode;
        local_34 = local_34 + 1;
        _unoccupied = _unoccupied + 1;
        mode = mode + 1;
      }
    }
    else {
      for (local_34 = 0; local_34 < 8; local_34 = local_34 + 1) {
        *_unoccupied = '0';
        _unoccupied = _unoccupied + 1;
      }
    }
  }
  if (((ulong)dp & 4) != 0) {
    _unoccupied = pol->PhinfPartNumber;
    if (local_38 == 0) {
      local_34 = 0;
      while( true ) {
        bVar1 = false;
        if (local_34 < 0x14) {
          bVar1 = '\x1f' < *(char *)mode;
        }
        if (!bVar1) break;
        *_unoccupied = *(char *)mode;
        local_34 = local_34 + 1;
        _unoccupied = _unoccupied + 1;
        mode = mode + 1;
      }
    }
    else {
      for (local_34 = 0; local_34 < 0x14; local_34 = local_34 + 1) {
        *_unoccupied = ' ';
        _unoccupied = _unoccupied + 1;
      }
    }
  }
  if (((ulong)dp & 8) != 0) {
    _unoccupied = pol->PhinfAccessories;
    if (local_38 == 0) {
      local_34 = 0;
      while( true ) {
        bVar1 = false;
        if (local_34 < 2) {
          bVar1 = '\x1f' < *(char *)mode;
        }
        if (!bVar1) break;
        *_unoccupied = *(char *)mode;
        local_34 = local_34 + 1;
        _unoccupied = _unoccupied + 1;
        mode = mode + 1;
      }
    }
    else {
      for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
        *_unoccupied = '0';
        _unoccupied = _unoccupied + 1;
      }
    }
  }
  if (((ulong)dp & 0x10) != 0) {
    _unoccupied = pol->PhinfMarkerType;
    if (local_38 == 0) {
      local_34 = 0;
      while( true ) {
        bVar1 = false;
        if (local_34 < 2) {
          bVar1 = '\x1f' < *(char *)mode;
        }
        if (!bVar1) break;
        *_unoccupied = *(char *)mode;
        local_34 = local_34 + 1;
        _unoccupied = _unoccupied + 1;
        mode = mode + 1;
      }
    }
    else {
      for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
        *_unoccupied = '0';
        _unoccupied = _unoccupied + 1;
      }
    }
  }
  if (((ulong)dp & 0x20) != 0) {
    _unoccupied = pol->PhinfPortLocation;
    if (local_38 == 0) {
      local_34 = 0;
      while( true ) {
        bVar1 = false;
        if (local_34 < 0xe) {
          bVar1 = '\x1f' < *(char *)mode;
        }
        if (!bVar1) break;
        *_unoccupied = *(char *)mode;
        local_34 = local_34 + 1;
        _unoccupied = _unoccupied + 1;
        mode = mode + 1;
      }
    }
    else {
      for (local_34 = 0; local_34 < 0xe; local_34 = local_34 + 1) {
        *_unoccupied = '0';
        _unoccupied = _unoccupied + 1;
      }
    }
  }
  if (((ulong)dp & 0x40) != 0) {
    _unoccupied = pol->PhinfGpioStatus;
    if (local_38 == 0) {
      local_34 = 0;
      while( true ) {
        bVar1 = false;
        if (local_34 < 2) {
          bVar1 = '\x1f' < *(char *)mode;
        }
        if (!bVar1) break;
        *_unoccupied = *(char *)mode;
        local_34 = local_34 + 1;
        _unoccupied = _unoccupied + 1;
        mode = mode + 1;
      }
    }
    else {
      for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
        *_unoccupied = '0';
        _unoccupied = _unoccupied + 1;
      }
    }
  }
  return;
}

Assistant:

void ndiPHINFHelper(ndicapi* pol, const char* cp, const char* crp)
  {
    unsigned long mode = 0x0001; // the default reply mode
    char* dp;
    int j;
    int unoccupied = NDI_OKAY;

    // if the PHINF command had a reply mode, read it
    if ((cp[5] == ':' && cp[10] != '\r') || (cp[5] == ' ' && cp[6] != '\r'))
    {
      mode = ndiHexToUnsignedLong(&cp[8], 4);
    }

    // check for unoccupied
    if (*crp == 'U')
    {
      unoccupied = NDI_UNOCCUPIED;
    }
    pol->PhinfUnoccupied = unoccupied;

    // fprintf(stderr, "mode = %04lx\n", mode);

    if (mode & NDI_BASIC)
    {
      dp = pol->PhinfBasic;
      if (!unoccupied)
      {
        for (j = 0; j < 33 && *crp >= ' '; j++)
        {
          // fprintf(stderr,"%c",*crp);
          *dp++ = *crp++;
        }
        // fprintf(stderr,"\n");
      }
      else    // default "00000000            0000000000000"
      {
        for (j = 0; j < 8; j++)
        {
          *dp++ = '0';
        }
        for (j = 0; j < 12; j++)
        {
          *dp++ = ' ';
        }
        for (j = 0; j < 13; j++)
        {
          *dp++ = '0';
        }
      }
    }

    if (mode & NDI_TESTING)
    {
      dp = pol->PhinfTesting;
      if (!unoccupied)
      {
        for (j = 0; j < 8 && *crp >= ' '; j++)
        {
          *dp++ = *crp++;
        }
      }
      else   // default "00000000"
      {
        for (j = 0; j < 8; j++)
        {
          *dp++ = '0';
        }
      }
    }

    if (mode & NDI_PART_NUMBER)
    {
      dp = pol->PhinfPartNumber;
      if (!unoccupied)
      {
        for (j = 0; j < 20 && *crp >= ' '; j++)
        {
          *dp++ = *crp++;
        }
      }
      else   // default "                    "
      {
        for (j = 0; j < 20; j++)
        {
          *dp++ = ' ';
        }
      }
    }

    if (mode & NDI_ACCESSORIES)
    {
      dp = pol->PhinfAccessories;
      if (!unoccupied)
      {
        for (j = 0; j < 2 && *crp >= ' '; j++)
        {
          *dp++ = *crp++;
        }
      }
      else   // default "00"
      {
        for (j = 0; j < 2; j++)
        {
          *dp++ = '0';
        }
      }
    }

    if (mode & NDI_MARKER_TYPE)
    {
      dp = pol->PhinfMarkerType;
      if (!unoccupied)
      {
        for (j = 0; j < 2 && *crp >= ' '; j++)
        {
          *dp++ = *crp++;
        }
      }
      else   // default "00"
      {
        for (j = 0; j < 2; j++)
        {
          *dp++ = '0';
        }
      }
    }

    if (mode & NDI_PORT_LOCATION)
    {
      dp = pol->PhinfPortLocation;
      if (!unoccupied)
      {
        for (j = 0; j < 14 && *crp >= ' '; j++)
        {
          *dp++ = *crp++;
        }
      }
      else   // default "00000000000000"
      {
        for (j = 0; j < 14; j++)
        {
          *dp++ = '0';
        }
      }
    }

    if (mode & NDI_GPIO_STATUS)
    {
      dp = pol->PhinfGpioStatus;
      if (!unoccupied)
      {
        for (j = 0; j < 2 && *crp >= ' '; j++)
        {
          *dp++ = *crp++;
        }
      }
      else   // default "00"
      {
        for (j = 0; j < 2; j++)
        {
          *dp++ = '0';
        }
      }
    }
  }